

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall
PhyloTree::getEdgesNotInCommonWith
          (PhyloTree *this,PhyloTree *t,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  bool bVar4;
  runtime_error *this_00;
  PhyloTreeEdge *that_edge;
  pointer other;
  PhyloTreeEdge *this_edge;
  pointer __x;
  
  bVar3 = std::operator!=(&this->leaf2NumMap,&t->leaf2NumMap);
  if (!bVar3) {
    pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (__x = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start; __x != pPVar1; __x = __x + 1) {
      pPVar2 = (t->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar3 = true;
      for (other = (t->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start; other != pPVar2; other = other + 1) {
        bVar4 = PhyloTreeEdge::sameBipartition(__x,other);
        bVar3 = (bool)(bVar3 & !bVar4);
      }
      if (bVar3) {
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(dest,__x);
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"leaf2NumMaps are not equal");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PhyloTree::getEdgesNotInCommonWith(PhyloTree &t, vector<PhyloTreeEdge>& dest) {
    bool not_common;
    if (leaf2NumMap != t.leaf2NumMap) {
        throw runtime_error("leaf2NumMaps are not equal");
    }
    for (auto &this_edge : edges) {
        not_common = true;
        //if (this_edge.isZero()) continue;

        for (auto &that_edge : t.edges) {
            //if (that_edge.isZero()) continue;
            if (this_edge.sameBipartition(that_edge)) {
                not_common = false;
            }
        }
        if (not_common)
            dest.push_back(this_edge);
    }
}